

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O2

void Hop_TableProfile(Hop_Man_t *p)

{
  anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *paVar1;
  int iVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < p->nTableSize; lVar3 = lVar3 + 1) {
    paVar1 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2 *)(p->pTable + lVar3);
    iVar2 = 0;
    while( true ) {
      if (paVar1->pNext == (Hop_Obj_t *)0x0) break;
      iVar2 = iVar2 + 1;
      paVar1 = &paVar1->pNext->field_1;
    }
    if (iVar2 != 0) {
      printf("%d ");
    }
  }
  return;
}

Assistant:

void Hop_TableProfile( Hop_Man_t * p )
{
    Hop_Obj_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}